

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O0

void alf_one_blk_chroma_u_or_v
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int local_88;
  pel local_84;
  int local_80;
  int xRight;
  int xLeft;
  int sum;
  int endPos;
  int startPos;
  int j;
  int i;
  pel *p6;
  pel *p5;
  pel *p4;
  pel *p3;
  pel *p2;
  pel *p1;
  int lcu_height_local;
  int lcu_width_local;
  int i_src_local;
  pel *src_local;
  pel *ppStack_10;
  int i_dst_local;
  pel *dst_local;
  
  _lcu_width_local = src;
  ppStack_10 = dst;
  for (startPos = 0; startPos < lcu_height; startPos = startPos + 1) {
    p2 = _lcu_width_local + i_src;
    p3 = _lcu_width_local + -(long)i_src;
    p4 = _lcu_width_local + (i_src << 1);
    p5 = _lcu_width_local + -(long)(i_src << 1);
    p6 = _lcu_width_local + i_src * 3;
    _j = _lcu_width_local + -(long)(i_src * 3);
    if (startPos < 3) {
      if (startPos == 0) {
        p3 = _lcu_width_local;
        p5 = _lcu_width_local;
      }
      else if (startPos == 1) {
        p5 = p3;
      }
      _j = p5;
    }
    else if (lcu_height + -4 < startPos) {
      if (startPos == lcu_height + -1) {
        p2 = _lcu_width_local;
        p4 = _lcu_width_local;
      }
      else if (startPos == lcu_height + -2) {
        p4 = p2;
      }
      p6 = p4;
    }
    for (endPos = 0; SBORROW4(endPos,lcu_width * 2) != endPos + lcu_width * -2 < 0;
        endPos = endPos + 2) {
      iVar1 = endPos + -2;
      iVar2 = endPos + 2;
      local_88 = (int)(coef[0x10] * (uint)_lcu_width_local[endPos] +
                       coef[10] *
                       ((uint)_lcu_width_local[endPos + 6] + (uint)_lcu_width_local[endPos + -6]) +
                       coef[0xc] *
                       ((uint)_lcu_width_local[endPos + 4] + (uint)_lcu_width_local[endPos + -4]) +
                       coef[0xe] * ((uint)_lcu_width_local[iVar2] + (uint)_lcu_width_local[iVar1]) +
                       coef[8] * ((uint)p2[iVar1] + (uint)p3[iVar2]) +
                       coef[6] * ((uint)p2[endPos] + (uint)p3[endPos]) +
                       coef[4] * ((uint)p2[iVar2] + (uint)p3[iVar1]) +
                       coef[2] * ((uint)p4[endPos] + (uint)p5[endPos]) +
                       *coef * ((uint)p6[endPos] + (uint)_j[endPos]) + 0x20) >> 6;
      bVar3 = (byte)sample_bit_depth;
      local_80 = local_88;
      if ((1 << (bVar3 & 0x1f)) + -1 < local_88) {
        local_80 = (1 << (bVar3 & 0x1f)) + -1;
      }
      if (local_80 < 0) {
        local_84 = '\0';
      }
      else {
        if ((1 << (bVar3 & 0x1f)) + -1 < local_88) {
          local_88 = (1 << (bVar3 & 0x1f)) + -1;
        }
        local_84 = (pel)local_88;
      }
      ppStack_10[endPos] = local_84;
    }
    _lcu_width_local = _lcu_width_local + i_src;
    ppStack_10 = ppStack_10 + i_dst;
  }
  return;
}

Assistant:

static void alf_one_blk_chroma_u_or_v(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;

    for (i = startPos; i < endPos; i++)
    {
        p1 = src + i_src;
        p2 = src - i_src;
        p3 = src + 2 * i_src;
        p4 = src - 2 * i_src;
        p5 = src + 3 * i_src;
        p6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                p4 = p2 = src;
            }
            else if (i == 1) {
                p4 = p2;
            }
            p6 = p4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                p3 = p1 = src;
            }
            else if (i == lcu_height - 2) {
                p3 = p1;
            }
            p5 = p3;
        }

        for (j = 0; j < lcu_width << 1; j += 2)
        {
            int sum;
            int xLeft = j - 2;
            int xRight = j + 2;

            sum = coef[0] * (p5[j] + p6[j]);
            sum += coef[2] * (p3[j] + p4[j]);
            sum += coef[4] * (p1[xRight] + p2[xLeft]);
            sum += coef[6] * (p1[j] + p2[j]);
            sum += coef[8] * (p1[xLeft] + p2[xRight]);
            sum += coef[14] * (src[xRight] + src[xLeft]);

            xLeft = j - 4;
            xRight = j + 4;
            sum += coef[12] * (src[xRight] + src[xLeft]);

            xLeft = j - 6;
            xRight = j + 6;
            sum += coef[10] * (src[xRight] + src[xLeft]);

            sum += coef[16] * (src[j]);

            sum = (int)((sum + 32) >> 6);

            dst[j] = COM_CLIP3(0, ((1 << sample_bit_depth) - 1), sum);

        }
        src += i_src;
        dst += i_dst;
    }
}